

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O3

blargg_err_t __thiscall Vgm_File::track_info_(Vgm_File *this,track_info_t *out,int param_2)

{
  size_t sVar1;
  byte_ *in;
  
  get_vgm_length(&this->h,out);
  sVar1 = (this->gd3).size_;
  if (sVar1 != 0) {
    in = (this->gd3).begin_;
    parse_gd3(in,in + sVar1,out);
  }
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t track_info_( track_info_t* out, int ) const
	{
		get_vgm_length( h, out );
		if ( gd3.size() )
			parse_gd3( gd3.begin(), gd3.end(), out );
		return 0;
	}